

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDFHDD.cpp
# Opt level: O1

bool HDFHDD::IsRecognised(string *path)

{
  int __fd;
  ssize_t sVar1;
  bool bVar2;
  RS_IDE sHeader;
  undefined8 local_38;
  undefined6 uStack_30;
  undefined2 uStack_2a;
  undefined6 uStack_28;
  
  local_38 = 0;
  uStack_30 = 0;
  uStack_2a = 0;
  uStack_28 = 0;
  __fd = open64((path->_M_dataplus)._M_p,2);
  if ((__fd == -1) && (__fd = open64((path->_M_dataplus)._M_p,0), __fd == -1)) {
    return false;
  }
  sVar1 = read(__fd,&local_38,0x16);
  if (sVar1 == 0x16) {
    bVar2 = local_38._4_2_ == 0x4544 && (int)local_38 == 0x492d5352;
  }
  else {
    bVar2 = false;
  }
  close(__fd);
  return bVar2;
}

Assistant:

bool HDFHDD::IsRecognised(const std::string& path)
{
    int h = -1;
    RS_IDE sHeader = {};

    // Open as read-write, falling back on read-only
    if ((h = open(path.c_str(), O_RDWR | O_BINARY)) == -1 &&
        (h = open(path.c_str(), O_RDONLY | O_BINARY)) == -1)
        return false;

    // Read the file header and check the signature string
    if (read(h, &sHeader, sizeof(sHeader)) != sizeof(sHeader) ||
        memcmp(sHeader.szSignature, "RS-IDE", sizeof(sHeader.szSignature)))
    {
        close(h);
        return false;
    }

    // Appears valid
    close(h);
    return true;
}